

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

iterator __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::erase(rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
        *this,const_iterator iter)

{
  bool bVar1;
  __pointer_type local_60;
  zombie_list_node *oldZombie;
  pointer local_48;
  pointer newZombie;
  node *oldNext;
  node *oldPrev;
  node *oldNextOrig;
  lock_guard<std::mutex> guard;
  rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
  *this_local;
  const_iterator iter_local;
  
  guard._M_device = (mutex_type *)this;
  this_local = (rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
                *)iter.m_current;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&oldNextOrig,&this->m_write_mutex);
  oldPrev = std::
            atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
            ::load(&this_local->m_head,memory_order_seq_cst);
  if (((ulong)(this_local->m_zombie_head)._M_b._M_p & 1) == 0) {
    *(undefined1 *)&(this_local->m_zombie_head)._M_b._M_p = 1;
    oldNext = std::
              atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
              ::load(&this_local->m_tail,memory_order_seq_cst);
    newZombie = (pointer)std::
                         atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
                         ::load(&this_local->m_head,memory_order_seq_cst);
    if (oldNext == (node *)0x0) {
      std::
      atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
      ::store(&this->m_head,(__pointer_type)newZombie,memory_order_seq_cst);
    }
    else {
      std::
      atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
      ::store(&oldNext->next,(__pointer_type)newZombie,memory_order_seq_cst);
    }
    if (newZombie == (pointer)0x0) {
      std::
      atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
      ::store(&this->m_tail,oldNext,memory_order_seq_cst);
    }
    else {
      std::
      atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
      ::store((atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
               *)&newZombie->owner,oldNext,memory_order_seq_cst);
    }
    local_48 = std::
               allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>_>
               ::allocate(&this->m_zombie_alloc,1);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node>>
    ::
    construct<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node,gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::node*&>
              (&this->m_zombie_alloc,local_48,(node **)&this_local);
    local_60 = std::
               atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
               ::load(&this->m_zombie_head,memory_order_seq_cst);
    do {
      std::
      atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
      ::operator=(&local_48->next,local_60);
      bVar1 = std::
              atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
              ::compare_exchange_weak(&this->m_zombie_head,&local_60,local_48,memory_order_seq_cst);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  iterator::iterator((iterator *)&iter_local,oldPrev);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&oldNextOrig);
  return (iterator)iter_local.m_current;
}

Assistant:

auto rcu_list<T, M, Alloc>::erase(const_iterator iter) -> iterator
{
    std::lock_guard<M> guard(m_write_mutex);
    // make sure the node has not already been marked for deletion
    node* oldNextOrig = iter.m_current->next.load();
    if (!iter.m_current->deleted) {
        iter.m_current->deleted = true;

        node* oldPrev = iter.m_current->back.load();
        node* oldNext = iter.m_current->next.load();

        if (oldPrev) {
            oldPrev->next.store(oldNext);
        } else {
            // no previous node, this node was the head
            m_head.store(oldNext);
        }

        if (oldNext) {
            oldNext->back.store(oldPrev);
        } else {
            // no next node, this node was the tail
            m_tail.store(oldPrev);
        }

        auto newZombie = zombie_alloc_trait::allocate(m_zombie_alloc, 1);
        zombie_alloc_trait::construct(m_zombie_alloc,
                                      newZombie,
                                      iter.m_current);

        zombie_list_node* oldZombie = m_zombie_head.load();

        do {
            newZombie->next = oldZombie;
        } while (!m_zombie_head.compare_exchange_weak(oldZombie, newZombie));
    }

    return iterator(oldNextOrig);
}